

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int NGA_Locate64(int g_a,int64_t *subscript)

{
  logical lVar1;
  long in_RSI;
  int in_EDI;
  int i;
  Integer _ga_lo [7];
  Integer ndim;
  Integer owner;
  Integer a;
  logical st;
  Integer in_stack_00000180;
  Integer *in_stack_000002b8;
  Integer *in_stack_000002c0;
  Integer in_stack_000002c8;
  int local_6c;
  long local_68 [7];
  long local_30;
  int local_28;
  long local_20;
  long local_10;
  int local_4;
  
  local_20 = (long)in_EDI;
  local_10 = in_RSI;
  local_30 = pnga_ndim(in_stack_00000180);
  for (local_6c = 0; local_6c < local_30; local_6c = local_6c + 1) {
    local_68[(local_30 - local_6c) + -1] = *(long *)(local_10 + (long)local_6c * 8) + 1;
  }
  lVar1 = pnga_locate(in_stack_000002c8,in_stack_000002c0,in_stack_000002b8);
  if (lVar1 == 1) {
    local_4 = local_28;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int NGA_Locate64(int g_a, int64_t subscript[])
{
    logical st;
    Integer a=(Integer)g_a, owner;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM];
    COPYINDEX_C2F(subscript,_ga_lo,ndim);

    st = wnga_locate(a,_ga_lo,&owner);
    if(st == TRUE) return (int)owner;
    else return -1;
}